

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_tree_clusterizer.h
# Opt level: O1

void crnlib::split_vectors<crnlib::vec<1u,float>>
               (vec<1U,_float> (*vectors) [64],uint (*weights) [64],uint size,
               vec<1U,_float> (*result) [2])

{
  double dVar1;
  uint i;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  float fVar9;
  float fVar10;
  double dVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  float in_XMM3_Da;
  float fVar15;
  float fVar16;
  float fVar17;
  float in_XMM11_Da;
  vec<1U,_float> weightedVectors [64];
  double weightedDotProducts [64];
  float afStack_328 [64];
  double adStack_228 [64];
  
  uVar7 = (ulong)size;
  if (size == 0) {
    dVar11 = 0.0;
    fVar12 = 0.0;
    fVar10 = 0.0;
  }
  else {
    fVar12 = 0.0;
    dVar11 = 0.0;
    uVar4 = 0;
    uVar3 = 0;
    do {
      uVar8 = (*weights)[uVar4];
      fVar9 = (float)uVar8;
      fVar10 = (*vectors)[uVar4].m_s[0];
      fVar15 = fVar10 * fVar9;
      afStack_328[uVar4] = fVar15;
      fVar12 = fVar12 + fVar15;
      uVar3 = uVar3 + uVar8;
      in_XMM3_Da = fVar10 * fVar10 * fVar9;
      adStack_228[uVar4] = (double)in_XMM3_Da;
      dVar11 = dVar11 + (double)in_XMM3_Da;
      uVar4 = uVar4 + 1;
    } while (uVar7 != uVar4);
    if ((long)uVar3 < 0) {
      fVar10 = (float)uVar3;
    }
    else {
      fVar10 = (float)(long)uVar3;
    }
  }
  fVar9 = (1.0 / fVar10) * fVar12;
  (*result)[1].m_s[0] = fVar9;
  (*result)[0].m_s[0] = fVar9;
  if (size != 1) {
    fVar12 = (float)(dVar11 - (double)((fVar12 * fVar12) / fVar10));
    dVar11 = (double)(ulong)(uint)fVar12;
    if (0.0 < fVar12) {
      dVar1 = (double)(ulong)(uint)in_XMM3_Da;
      if (size != 0) {
        dVar11 = -1.0;
        uVar3 = 0;
        in_XMM11_Da = 0.0;
        do {
          fVar12 = (*vectors)[uVar3].m_s[0];
          fVar15 = fVar12 - fVar9;
          dVar1 = (double)(fVar15 * fVar15);
          if (dVar1 <= dVar11) {
            dVar1 = dVar11;
            fVar12 = in_XMM11_Da;
          }
          in_XMM11_Da = fVar12;
          dVar11 = dVar1;
          uVar3 = uVar3 + 1;
          dVar1 = dVar11;
        } while (uVar7 != uVar3);
      }
      fVar12 = SUB84(dVar11,0);
      if (size != 0) {
        uVar3 = 0;
        fVar15 = -1.0;
        do {
          fVar12 = (*vectors)[uVar3].m_s[0];
          fVar16 = fVar12 - in_XMM11_Da;
          fVar16 = fVar16 * fVar16;
          dVar11 = (double)(ulong)(uint)fVar12;
          if (fVar16 <= fVar15) {
            fVar16 = fVar15;
            dVar11 = dVar1;
          }
          dVar1 = dVar11;
          fVar12 = SUB84(dVar1,0);
          uVar3 = uVar3 + 1;
          fVar15 = fVar16;
        } while (uVar7 != uVar3);
      }
      fVar15 = (in_XMM11_Da + fVar9) * 0.5;
      fVar12 = (fVar12 + fVar9) * 0.5;
      if (2 < size) {
        fVar16 = 0.0;
        uVar3 = 0;
        do {
          fVar13 = (*vectors)[uVar3].m_s[0] - fVar9;
          fVar16 = fVar16 + (float)(*weights)[uVar3] * fVar13 * fVar13;
          uVar3 = uVar3 + 1;
        } while (uVar7 != uVar3);
        iVar2 = 10;
        fVar13 = 1.0;
        do {
          fVar13 = fVar13 * (fVar16 / fVar10);
          fVar17 = fVar13 + 0.0;
          uVar8 = -(uint)(fVar13 != 0.0);
          fVar13 = (float)(uVar8 & (uint)((1.0 / fVar17) * fVar17) | ~uVar8 & (uint)fVar17);
          iVar2 = iVar2 + -1;
        } while (iVar2 != 0);
        fVar10 = fVar13 * fVar13;
        if ((fVar10 != 0.0) || (NAN(fVar10))) {
          dVar11 = (double)fVar10;
          if (dVar11 < 0.0) {
            dVar11 = sqrt(dVar11);
          }
          else {
            dVar11 = SQRT(dVar11);
          }
          fVar13 = fVar13 * (float)(1.0 / dVar11);
        }
        auVar14 = ZEXT816(0);
        uVar3 = 0;
        fVar16 = 0.0;
        fVar10 = 0.0;
        do {
          if (0.0 <= ((*vectors)[uVar3].m_s[0] - fVar9) * fVar13) {
            fVar16 = fVar16 + afStack_328[uVar3];
            auVar14._8_8_ = auVar14._8_8_ + (double)(*weights)[uVar3];
          }
          else {
            fVar10 = fVar10 + afStack_328[uVar3];
            auVar14._0_8_ = auVar14._0_8_ + (double)(*weights)[uVar3];
          }
          uVar3 = uVar3 + 1;
        } while (size + (size == 0) != uVar3);
        if ((0.0 < auVar14._0_8_) && (0.0 < auVar14._8_8_)) {
          auVar14 = divpd(_DAT_001baa50,auVar14);
          fVar15 = fVar10 * (float)auVar14._0_8_;
          fVar12 = fVar16 * (float)auVar14._8_8_;
        }
      }
      fVar10 = 1e+10;
      iVar2 = 0;
      do {
        if (size == 0) {
          dVar1 = 0.0;
          fVar16 = 0.0;
          fVar9 = 0.0;
          uVar4 = 0;
          uVar3 = 0;
          dVar11 = 0.0;
        }
        else {
          fVar9 = 0.0;
          dVar11 = 0.0;
          uVar6 = 0;
          dVar1 = 0.0;
          uVar3 = 0;
          uVar4 = 0;
          fVar16 = 0.0;
          do {
            fVar13 = (*vectors)[uVar6].m_s[0];
            fVar17 = fVar15 - fVar13;
            fVar13 = fVar12 - fVar13;
            if (fVar13 * fVar13 <= fVar17 * fVar17) {
              fVar9 = fVar9 + afStack_328[uVar6];
              dVar11 = dVar11 + adStack_228[uVar6];
              uVar3 = uVar3 + (*weights)[uVar6];
            }
            else {
              fVar16 = fVar16 + afStack_328[uVar6];
              dVar1 = dVar1 + adStack_228[uVar6];
              uVar4 = uVar4 + (*weights)[uVar6];
            }
            uVar6 = uVar6 + 1;
          } while (uVar7 != uVar6);
        }
        iVar5 = 1;
        if (uVar4 != 0 && uVar3 != 0) {
          fVar15 = (1.0 / (float)uVar4) * fVar16;
          fVar12 = (1.0 / (float)uVar3) * fVar9;
          fVar9 = (float)(dVar11 - (double)((fVar9 * fVar9) / (float)uVar3)) +
                  (float)(dVar1 - (double)((fVar16 * fVar16) / (float)uVar4));
          iVar5 = 0x26;
          if (1e-05 <= fVar9) {
            fVar16 = (fVar10 - fVar9) / fVar9;
            uVar8 = -(uint)(fVar16 < 1e-05);
            fVar10 = (float)((uint)fVar10 & uVar8 | ~uVar8 & (uint)fVar9);
            iVar5 = 0;
            if (fVar16 < 1e-05) {
              iVar5 = 0x26;
            }
          }
        }
        if (iVar5 != 0) goto LAB_00189c2a;
        iVar2 = iVar2 + 1;
      } while (iVar2 != 0x400);
      iVar5 = 0x26;
LAB_00189c2a:
      if (iVar5 == 0x26) {
        (*result)[0].m_s[0] = fVar15;
        (*result)[1].m_s[0] = fVar12;
      }
    }
  }
  return;
}

Assistant:

void split_vectors(VectorType (&vectors)[64], uint (&weights)[64], uint size, VectorType (&result)[2]) {
  VectorType weightedVectors[64];
  double weightedDotProducts[64];
  VectorType centroid(cClear);
  uint64 total_weight = 0;
  double ttsum = 0.0f;
  for (uint i = 0; i < size; i++) {
    const VectorType& v = vectors[i];
    const uint weight = weights[i];
    weightedVectors[i] = v * (float)weight;
    centroid += weightedVectors[i];
    total_weight += weight;
    weightedDotProducts[i] = v.dot(v) * weight;
    ttsum += weightedDotProducts[i];
  }
  float variance = (float)(ttsum - (centroid.dot(centroid) / total_weight));
  centroid *= (1.0f / total_weight);
  result[0] = result[1] = centroid;
  if (variance <= 0.0f || size == 1)
    return;
  VectorType furthest;
  double furthest_dist = -1.0f;
  for (uint i = 0; i < size; i++) {
    const VectorType& v = vectors[i];
    double dist = v.squared_distance(centroid);
    if (dist > furthest_dist) {
      furthest_dist = dist;
      furthest = v;
    }
  }
  VectorType opposite;
  double opposite_dist = -1.0f;
  for (uint i = 0; i < size; i++) {
    const VectorType& v = vectors[i];
    double dist = v.squared_distance(furthest);
    if (dist > opposite_dist) {
      opposite_dist = dist;
      opposite = v;
    }
  }
  VectorType left_child((furthest + centroid) * .5f);
  VectorType right_child((opposite + centroid) * .5f);
  if (size > 2) {
    const uint N = VectorType::num_elements;
    matrix<N, N, float> covar;
    covar.clear();
    for (uint i = 0; i < size; i++) {
      const VectorType& v = vectors[i] - centroid;
      const VectorType w = v * (float)weights[i];
      for (uint x = 0; x < N; x++) {
        for (uint y = x; y < N; y++)
          covar[x][y] = covar[x][y] + v[x] * w[y];
      }
    }
    float divider = (float)total_weight;
    for (uint x = 0; x < N; x++) {
      for (uint y = x; y < N; y++) {
        covar[x][y] /= divider;
        covar[y][x] = covar[x][y];
      }
    }
    VectorType axis(1.0f);
    for (uint iter = 0; iter < 10; iter++) {
      VectorType x;
      double max_sum = 0;
      for (uint i = 0; i < N; i++) {
        double sum = 0;
        for (uint j = 0; j < N; j++)
          sum += axis[j] * covar[i][j];
        x[i] = (float)sum;
        max_sum = i ? math::maximum(max_sum, sum) : sum;
      }
      if (max_sum != 0.0f)
        x *= (float)(1.0f / max_sum);
      axis = x;
    }
    axis.normalize();
    VectorType new_left_child(0.0f);
    VectorType new_right_child(0.0f);
    double left_weight = 0.0f;
    double right_weight = 0.0f;
    for (uint i = 0; i < size; i++) {
      const VectorType& v = vectors[i];
      const float weight = (float)weights[i];
      double t = (v - centroid) * axis;
      if (t < 0.0f) {
        new_left_child += weightedVectors[i];
        left_weight += weight;
      } else {
        new_right_child += weightedVectors[i];
        right_weight += weight;
      }
    }
    if ((left_weight > 0.0f) && (right_weight > 0.0f)) {
      left_child = new_left_child * (float)(1.0f / left_weight);
      right_child = new_right_child * (float)(1.0f / right_weight);
    }
  }
  uint64 left_weight = 0;
  uint64 right_weight = 0;
  float prev_total_variance = 1e+10f;
  float left_variance = 0.0f;
  float right_variance = 0.0f;
  const uint cMaxLoops = 1024;
  for (uint total_loops = 0; total_loops < cMaxLoops; total_loops++) {
    VectorType new_left_child(cClear);
    VectorType new_right_child(cClear);
    double left_ttsum = 0.0f;
    double right_ttsum = 0.0f;
    left_weight = 0;
    right_weight = 0;
    for (uint i = 0; i < size; i++) {
      const VectorType& v = vectors[i];
      double left_dist2 = left_child.squared_distance(v);
      double right_dist2 = right_child.squared_distance(v);
      if (left_dist2 < right_dist2) {
        new_left_child += weightedVectors[i];
        left_ttsum += weightedDotProducts[i];
        left_weight += weights[i];
      } else {
        new_right_child += weightedVectors[i];
        right_ttsum += weightedDotProducts[i];
        right_weight += weights[i];
      }
    }
    if ((!left_weight) || (!right_weight))
      return;
    left_variance = (float)(left_ttsum - (new_left_child.dot(new_left_child) / left_weight));
    right_variance = (float)(right_ttsum - (new_right_child.dot(new_right_child) / right_weight));
    new_left_child *= (1.0f / left_weight);
    new_right_child *= (1.0f / right_weight);
    left_child = new_left_child;
    right_child = new_right_child;
    float total_variance = left_variance + right_variance;
    if (total_variance < .00001f)
      break;
    if (((prev_total_variance - total_variance) / total_variance) < .00001f)
      break;
    prev_total_variance = total_variance;
  }
  result[0] = left_child;
  result[1] = right_child;
}